

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::inverse<2>(MatrixCaseUtils *this,Matrix<float,_2,_2> *mat)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  Matrix<float,_2,_2> MVar4;
  float det;
  Matrix<float,_2,_2> *mat_local;
  Matrix<float,_2,_2> *retVal;
  
  fVar2 = determinant<2>(mat);
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()(mat,1,1);
  fVar3 = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,0,0);
  *pfVar1 = fVar3 / fVar2;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()(mat,0,1);
  fVar3 = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,0,1);
  *pfVar1 = -fVar3 / fVar2;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()(mat,1,0);
  fVar3 = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,1,0);
  *pfVar1 = -fVar3 / fVar2;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()(mat,0,0);
  fVar3 = 0.0;
  MVar4.m_data.m_data[0].m_data[0] = *pfVar1 / fVar2;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,1,1);
  MVar4.m_data.m_data[0].m_data[1] = 0.0;
  *pfVar1 = MVar4.m_data.m_data[0].m_data[0];
  MVar4.m_data.m_data[1].m_data[1] = fVar3;
  MVar4.m_data.m_data[1].m_data[0] = fVar2;
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

tcu::Matrix<float, 2, 2> inverse<2> (const tcu::Matrix<float, 2, 2>& mat)
{
	const float					det		= determinant(mat);
	tcu::Matrix<float, 2, 2>	retVal;

	DE_ASSERT(det != 0.0f);

	retVal(0, 0) =  mat(1, 1) / det;
	retVal(0, 1) = -mat(0, 1) / det;
	retVal(1, 0) = -mat(1, 0) / det;
	retVal(1, 1) =  mat(0, 0) / det;

	return retVal;
}